

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_semaphore_wrapper.hpp
# Opt level: O0

bool __thiscall
oqpi::posix_semaphore_wrapper::waitFor<long,std::ratio<1l,1000000l>>
          (posix_semaphore_wrapper *this,duration<long,_std::ratio<1L,_1000000L>_> *relTime)

{
  FILE *pFVar1;
  int iVar2;
  uint *puVar3;
  rep rVar4;
  int *piVar5;
  int error;
  duration<long,_std::ratio<1L,_1L>_> local_40;
  __enable_if_is_duration<std::chrono::duration<long>_> secs;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> nanoseconds;
  timespec t;
  duration<long,_std::ratio<1L,_1000000L>_> *relTime_local;
  posix_semaphore_wrapper *this_local;
  
  iVar2 = clock_gettime(0,(timespec *)&nanoseconds);
  pFVar1 = _stderr;
  if (iVar2 == -1) {
    puVar3 = (uint *)__errno_location();
    fprintf(pFVar1,"[error  ] clock_gettime failed with error code %d\n",(ulong)*puVar3);
    this_local._7_1_ = false;
  }
  else {
    secs.__r = (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000000l>>
                              (relTime);
    local_40.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)&secs);
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long,std::ratio<1l,1l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&stack0xffffffffffffffb8,&local_40);
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-=
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)&secs,
               (duration<long,_std::ratio<1L,_1000000000L>_> *)&stack0xffffffffffffffb8);
    rVar4 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_40);
    nanoseconds.__r = rVar4 + nanoseconds.__r;
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::count
              ((duration<long,_std::ratio<1L,_1000000000L>_> *)&secs);
    iVar2 = sem_timedwait((sem_t *)this->handle_,(timespec *)&nanoseconds);
    if (iVar2 == -1) {
      piVar5 = __errno_location();
      pFVar1 = _stderr;
      if (*piVar5 != 0x6e) {
        puVar3 = (uint *)__errno_location();
        fprintf(pFVar1,"[error  ] sem_timedwait failed with error code %d\n",(ulong)*puVar3);
      }
    }
    this_local._7_1_ = iVar2 == 0;
  }
  return this_local._7_1_;
}

Assistant:

bool waitFor(const std::chrono::duration<_Rep, _Period> &relTime)
        {
            timespec t;
            if (clock_gettime(CLOCK_REALTIME, &t) == -1)
            {
                oqpi_error("clock_gettime failed with error code %d", errno);
                return false;
            }

            auto nanoseconds    = std::chrono::duration_cast<std::chrono::nanoseconds>(relTime);
            const auto secs     = std::chrono::duration_cast<std::chrono::seconds>(nanoseconds);
            nanoseconds         -= secs;
            t.tv_sec            += secs.count();
            t.tv_nsec           += nanoseconds.count();

            const auto error    = sem_timedwait(handle_, &t);
            if(error == -1 && errno != ETIMEDOUT)
            {
                oqpi_error("sem_timedwait failed with error code %d", errno);
            }
            return error == 0;
        }